

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O3

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDeclsCtx::addMemory
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *this,Name name,
          vector<wasm::Name,_std::allocator<wasm::Name>_> *exports,ImportNames *import,MemType type,
          Index pos)

{
  undefined8 *puVar1;
  long *plVar2;
  _Uninitialized<wasm::Memory_*,_true> _Var3;
  Result<wasm::Ok> *pRVar4;
  undefined1 local_c8 [8];
  Result<wasm::Memory_*> m;
  long *local_88;
  undefined8 local_80;
  long local_78;
  undefined8 uStack_70;
  Result<wasm::Ok> *local_68;
  undefined1 local_60 [8];
  Result<wasm::Ok> _val;
  
  m.val.super__Variant_base<wasm::Memory_*,_wasm::Err>.
  super__Move_assign_alias<wasm::Memory_*,_wasm::Err>.
  super__Copy_assign_alias<wasm::Memory_*,_wasm::Err>.
  super__Move_ctor_alias<wasm::Memory_*,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Memory_*,_wasm::Err>.
  super__Variant_storage_alias<wasm::Memory_*,_wasm::Err>._32_8_ = exports;
  local_68 = __return_storage_ptr__;
  checkImport((Result<wasm::Ok> *)local_60,this,pos,import);
  if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
    _Var3._M_storage =
         (Memory *)
         ((long)&m.val.super__Variant_base<wasm::Memory_*,_wasm::Err>.
                 super__Move_assign_alias<wasm::Memory_*,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Memory_*,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Memory_*,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Memory_*,_wasm::Err> + 8);
    local_c8 = (undefined1  [8])_Var3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c8,local_60,
               _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ + (long)local_60);
    pRVar4 = local_68;
    puVar1 = (undefined8 *)
             ((long)&(local_68->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(local_68->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
    if (local_c8 == (undefined1  [8])_Var3._M_storage) {
      *puVar1 = m.val.super__Variant_base<wasm::Memory_*,_wasm::Err>.
                super__Move_assign_alias<wasm::Memory_*,_wasm::Err>.
                super__Copy_assign_alias<wasm::Memory_*,_wasm::Err>.
                super__Move_ctor_alias<wasm::Memory_*,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Memory_*,_wasm::Err>.
                super__Variant_storage_alias<wasm::Memory_*,_wasm::Err>._M_u._8_8_;
      *(undefined8 *)
       ((long)&(local_68->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
           m.val.super__Variant_base<wasm::Memory_*,_wasm::Err>.
           super__Move_assign_alias<wasm::Memory_*,_wasm::Err>.
           super__Copy_assign_alias<wasm::Memory_*,_wasm::Err>.
           super__Move_ctor_alias<wasm::Memory_*,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Memory_*,_wasm::Err>.
           super__Variant_storage_alias<wasm::Memory_*,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(local_68->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_c8;
      *(undefined8 *)
       ((long)&(local_68->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
           m.val.super__Variant_base<wasm::Memory_*,_wasm::Err>.
           super__Move_assign_alias<wasm::Memory_*,_wasm::Err>.
           super__Copy_assign_alias<wasm::Memory_*,_wasm::Err>.
           super__Move_ctor_alias<wasm::Memory_*,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Memory_*,_wasm::Err>.
           super__Variant_storage_alias<wasm::Memory_*,_wasm::Err>._M_u._8_8_;
    }
    ((_Uninitialized<wasm::Memory_*,_true> *)
    ((long)&(local_68->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8))->_M_storage =
         (Memory *)
         m.val.super__Variant_base<wasm::Memory_*,_wasm::Err>.
         super__Move_assign_alias<wasm::Memory_*,_wasm::Err>.
         super__Copy_assign_alias<wasm::Memory_*,_wasm::Err>.
         super__Move_ctor_alias<wasm::Memory_*,_wasm::Err>.
         super__Copy_ctor_alias<wasm::Memory_*,_wasm::Err>.
         super__Variant_storage_alias<wasm::Memory_*,_wasm::Err>._M_u._M_first._M_storage;
    *(__index_type *)
     ((long)&(local_68->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_60);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_60);
    addMemoryDecl((Result<wasm::Memory_*> *)local_c8,this,pos,name,import,type);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Memory_*,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::Memory_*,_wasm::Err> *)local_60,
               (_Copy_ctor_base<false,_wasm::Memory_*,_wasm::Err> *)local_c8);
    pRVar4 = local_68;
    if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      local_88 = &local_78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,local_60,
                 _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ + (long)local_60);
      plVar2 = (long *)((long)&(pRVar4->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
      *(long **)&(pRVar4->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> = plVar2;
      if (local_88 == &local_78) {
        *plVar2 = local_78;
        *(undefined8 *)
         ((long)&(pRVar4->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_70;
      }
      else {
        *(long **)&(pRVar4->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_88;
        *(long *)((long)&(pRVar4->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) = local_78;
      }
      *(undefined8 *)
       ((long)&(pRVar4->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_80;
      *(__index_type *)
       ((long)&(pRVar4->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
      std::__detail::__variant::_Variant_storage<false,_wasm::Memory_*,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Memory_*,_wasm::Err> *)local_60);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Memory_*,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Memory_*,_wasm::Err> *)local_60);
      anon_unknown_2::addExports
                ((Result<wasm::Ok> *)local_60,(anon_unknown_2 *)this,(Lexer *)this->wasm,
                 (Module *)local_c8,
                 *(Named **)
                  m.val.super__Variant_base<wasm::Memory_*,_wasm::Err>.
                  super__Move_assign_alias<wasm::Memory_*,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Memory_*,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Memory_*,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Memory_*,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Memory_*,_wasm::Err>._32_8_,
                 *(vector<wasm::Name,_std::allocator<wasm::Name>_> **)
                  (m.val.super__Variant_base<wasm::Memory_*,_wasm::Err>.
                   super__Move_assign_alias<wasm::Memory_*,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Memory_*,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Memory_*,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Memory_*,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Memory_*,_wasm::Err>._32_8_ + 8),Memory);
      if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
        local_88 = &local_78;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,local_60,
                   _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ + (long)local_60);
        plVar2 = (long *)((long)&(pRVar4->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
        *(long **)&(pRVar4->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> = plVar2;
        if (local_88 == &local_78) {
          *plVar2 = local_78;
          *(undefined8 *)
           ((long)&(pRVar4->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_70;
        }
        else {
          *(long **)&(pRVar4->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_88;
          *(long *)((long)&(pRVar4->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) = local_78;
        }
        *(undefined8 *)
         ((long)&(pRVar4->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_80;
        *(__index_type *)
         ((long)&(pRVar4->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_60);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_60);
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_4_ = pos;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._12_4_ =
             (int)((ulong)((long)(this->memoryDefs).
                                 super__Vector_base<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->memoryDefs).
                                super__Vector_base<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_ = 0;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_8_ = 0;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index = '\0';
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._33_7_ = 0;
        local_60 = (undefined1  [8])name.super_IString.str._M_len;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = name.super_IString.str._M_str
        ;
        std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::
        emplace_back<wasm::WATParser::DefPos>(&this->memoryDefs,(DefPos *)local_60);
        if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_ != 0) {
          operator_delete((void *)_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_,
                          _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ -
                          _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_);
        }
        *(__index_type *)
         ((long)&(pRVar4->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
      }
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Memory_*,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Memory_*,_wasm::Err> *)local_c8);
  }
  return pRVar4;
}

Assistant:

Result<> ParseDeclsCtx::addMemory(Name name,
                                  const std::vector<Name>& exports,
                                  ImportNames* import,
                                  MemType type,
                                  Index pos) {
  CHECK_ERR(checkImport(pos, import));
  auto m = addMemoryDecl(pos, name, import, type);
  CHECK_ERR(m);
  CHECK_ERR(addExports(in, wasm, *m, exports, ExternalKind::Memory));
  // TODO: memory annotations
  memoryDefs.push_back({name, pos, Index(memoryDefs.size()), {}});
  return Ok{};
}